

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaDeriveAndValidateFacets(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaTypePtr pxVar1;
  xmlNodePtr pxVar2;
  xmlSchemaFacetPtr item;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlSchemaFacetPtr pxVar6;
  xmlSchemaFacetPtr pxStack_e0;
  int res;
  xmlSchemaFacetPtr bfmaxexc;
  xmlSchemaFacetPtr bfminexc;
  xmlSchemaFacetPtr bfmaxinc;
  xmlSchemaFacetPtr bfmininc;
  xmlSchemaFacetPtr bfminlen;
  xmlSchemaFacetPtr bfmaxlen;
  xmlSchemaFacetPtr bffracdig;
  xmlSchemaFacetPtr bftotdig;
  xmlSchemaFacetPtr bflength;
  xmlSchemaFacetPtr fmaxexc;
  xmlSchemaFacetPtr fminexc;
  xmlSchemaFacetPtr fmaxinc;
  xmlSchemaFacetPtr fmininc;
  xmlSchemaFacetPtr fminlen;
  xmlSchemaFacetPtr fmaxlen;
  xmlSchemaFacetPtr ffracdig;
  xmlSchemaFacetPtr ftotdig;
  xmlSchemaFacetPtr flength;
  xmlSchemaFacetPtr bfacet;
  xmlSchemaFacetPtr facet;
  xmlSchemaFacetLinkPtr last;
  xmlSchemaFacetLinkPtr cur;
  xmlSchemaFacetLinkPtr link;
  xmlSchemaTypePtr base;
  xmlSchemaTypePtr type_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  pxVar1 = type->baseType;
  ftotdig = (xmlSchemaFacetPtr)0x0;
  ffracdig = (xmlSchemaFacetPtr)0x0;
  fmaxlen = (xmlSchemaFacetPtr)0x0;
  fminlen = (xmlSchemaFacetPtr)0x0;
  fmininc = (xmlSchemaFacetPtr)0x0;
  fmaxinc = (xmlSchemaFacetPtr)0x0;
  fminexc = (xmlSchemaFacetPtr)0x0;
  fmaxexc = (xmlSchemaFacetPtr)0x0;
  bflength = (xmlSchemaFacetPtr)0x0;
  bftotdig = (xmlSchemaFacetPtr)0x0;
  bffracdig = (xmlSchemaFacetPtr)0x0;
  bfmaxlen = (xmlSchemaFacetPtr)0x0;
  bfminlen = (xmlSchemaFacetPtr)0x0;
  bfmininc = (xmlSchemaFacetPtr)0x0;
  bfmaxinc = (xmlSchemaFacetPtr)0x0;
  bfminexc = (xmlSchemaFacetPtr)0x0;
  bfmaxexc = (xmlSchemaFacetPtr)0x0;
  pxStack_e0 = (xmlSchemaFacetPtr)0x0;
  if ((type->facetSet == (xmlSchemaFacetLinkPtr)0x0) &&
     (pxVar1->facetSet == (xmlSchemaFacetLinkPtr)0x0)) {
    return 0;
  }
  facet = (xmlSchemaFacetPtr)type->facetSet;
  if (facet != (xmlSchemaFacetPtr)0x0) {
    for (; *(long *)facet != 0; facet = *(xmlSchemaFacetPtr *)facet) {
    }
  }
  for (last = type->facetSet; last != (xmlSchemaFacetLinkPtr)0x0; last = last->next) {
    pxVar6 = last->facet;
    switch(pxVar6->type) {
    case XML_SCHEMA_FACET_MININCLUSIVE:
      fmaxinc = pxVar6;
      break;
    case XML_SCHEMA_FACET_MINEXCLUSIVE:
      fmaxexc = pxVar6;
      break;
    case XML_SCHEMA_FACET_MAXINCLUSIVE:
      fminexc = pxVar6;
      break;
    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
      bflength = pxVar6;
      break;
    case XML_SCHEMA_FACET_TOTALDIGITS:
      ffracdig = pxVar6;
      break;
    case XML_SCHEMA_FACET_FRACTIONDIGITS:
      fmaxlen = pxVar6;
      break;
    default:
      break;
    case XML_SCHEMA_FACET_LENGTH:
      ftotdig = pxVar6;
      break;
    case XML_SCHEMA_FACET_MAXLENGTH:
      fminlen = pxVar6;
      break;
    case XML_SCHEMA_FACET_MINLENGTH:
      fmininc = pxVar6;
    }
  }
  for (last = pxVar1->facetSet; last != (xmlSchemaFacetLinkPtr)0x0; last = last->next) {
    pxVar6 = last->facet;
    switch(pxVar6->type) {
    case XML_SCHEMA_FACET_MININCLUSIVE:
      bfmaxinc = pxVar6;
      break;
    case XML_SCHEMA_FACET_MINEXCLUSIVE:
      bfmaxexc = pxVar6;
      break;
    case XML_SCHEMA_FACET_MAXINCLUSIVE:
      bfminexc = pxVar6;
      break;
    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
      pxStack_e0 = pxVar6;
      break;
    case XML_SCHEMA_FACET_TOTALDIGITS:
      bffracdig = pxVar6;
      break;
    case XML_SCHEMA_FACET_FRACTIONDIGITS:
      bfmaxlen = pxVar6;
      break;
    default:
      break;
    case XML_SCHEMA_FACET_LENGTH:
      bftotdig = pxVar6;
      break;
    case XML_SCHEMA_FACET_MAXLENGTH:
      bfminlen = pxVar6;
      break;
    case XML_SCHEMA_FACET_MINLENGTH:
      bfmininc = pxVar6;
    }
  }
  if ((ftotdig != (xmlSchemaFacetPtr)0x0) &&
     ((fmininc != (xmlSchemaFacetPtr)0x0 || (fminlen != (xmlSchemaFacetPtr)0x0)))) {
    xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)ftotdig,
                        ftotdig->node,
                        "It is an error for both \'length\' and either of \'minLength\' or \'maxLength\' to be specified on the same type definition"
                        ,(xmlChar *)0x0);
  }
  if ((fminexc != (xmlSchemaFacetPtr)0x0) && (bflength != (xmlSchemaFacetPtr)0x0)) {
    pxVar2 = fminexc->node;
    pxVar4 = xmlSchemaFacetTypeToString(fminexc->type);
    pxVar5 = xmlSchemaFacetTypeToString(bflength->type);
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fminexc,pxVar2,
               "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
               ,pxVar4,pxVar5,(xmlChar *)0x0);
  }
  if ((fmaxinc != (xmlSchemaFacetPtr)0x0) && (fmaxexc != (xmlSchemaFacetPtr)0x0)) {
    pxVar2 = fmaxinc->node;
    pxVar4 = xmlSchemaFacetTypeToString(fmaxinc->type);
    pxVar5 = xmlSchemaFacetTypeToString(fmaxexc->type);
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fmaxinc,pxVar2,
               "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
               ,pxVar4,pxVar5,(xmlChar *)0x0);
  }
  if ((ftotdig == (xmlSchemaFacetPtr)0x0) || (bftotdig == (xmlSchemaFacetPtr)0x0)) {
LAB_0021e41b:
    if ((fmininc != (xmlSchemaFacetPtr)0x0) && (bfmininc != (xmlSchemaFacetPtr)0x0)) {
      iVar3 = xmlSchemaCompareValues(fmininc->val,bfmininc->val);
      if (iVar3 == -2) goto LAB_0021f311;
      if (iVar3 == -1) {
        xmlSchemaDeriveFacetErr(pctxt,fmininc,bfmininc,1,1,1);
      }
      if ((iVar3 != 0) && (bfmininc->fixed != 0)) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fmininc,
                            fmininc->node,
                            "The base type\'s facet is \'fixed\', thus the value must not differ",
                            (xmlChar *)0x0);
      }
    }
    if ((fminlen != (xmlSchemaFacetPtr)0x0) && (bfminlen != (xmlSchemaFacetPtr)0x0)) {
      iVar3 = xmlSchemaCompareValues(fminlen->val,bfminlen->val);
      if (iVar3 == -2) goto LAB_0021f311;
      if (iVar3 == 1) {
        xmlSchemaDeriveFacetErr(pctxt,fminlen,bfminlen,-1,1,1);
      }
      if ((iVar3 != 0) && (bfminlen->fixed != 0)) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fminlen,
                            fminlen->node,
                            "The base type\'s facet is \'fixed\', thus the value must not differ",
                            (xmlChar *)0x0);
      }
    }
    if (ftotdig == (xmlSchemaFacetPtr)0x0) {
      ftotdig = bftotdig;
    }
    if (ftotdig != (xmlSchemaFacetPtr)0x0) {
      if (fmininc == (xmlSchemaFacetPtr)0x0) {
        fmininc = bfmininc;
      }
      if (fmininc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(ftotdig->val,fmininc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == -1) {
          xmlSchemaDeriveFacetErr(pctxt,ftotdig,fmininc,1,1,0);
        }
      }
      if (fminlen == (xmlSchemaFacetPtr)0x0) {
        fminlen = bfminlen;
      }
      if (fminlen != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(ftotdig->val,fminlen->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == 1) {
          xmlSchemaDeriveFacetErr(pctxt,ftotdig,fminlen,-1,1,0);
        }
      }
    }
    if (fminexc != (xmlSchemaFacetPtr)0x0) {
      if (fmaxinc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fminexc->val,fmaxinc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == -1) {
          xmlSchemaDeriveFacetErr(pctxt,fminexc,fmaxinc,1,1,0);
        }
      }
      if (bfminexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fminexc->val,bfminexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == 1) {
          xmlSchemaDeriveFacetErr(pctxt,fminexc,bfminexc,-1,1,1);
        }
        if ((iVar3 != 0) && (bfminexc->fixed != 0)) {
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fminexc,
                              fminexc->node,
                              "The base type\'s facet is \'fixed\', thus the value must not differ",
                              (xmlChar *)0x0);
        }
      }
      if (pxStack_e0 != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fminexc->val,pxStack_e0->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != -1) {
          xmlSchemaDeriveFacetErr(pctxt,fminexc,pxStack_e0,-1,0,1);
        }
      }
      if (bfmaxinc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fminexc->val,bfmaxinc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == -1) {
          xmlSchemaDeriveFacetErr(pctxt,fminexc,bfmaxinc,1,1,1);
        }
      }
      if (bfmaxexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fminexc->val,bfmaxexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != 1) {
          xmlSchemaDeriveFacetErr(pctxt,fminexc,bfmaxexc,1,0,1);
        }
      }
    }
    if (bflength != (xmlSchemaFacetPtr)0x0) {
      if (fmaxexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(bflength->val,fmaxexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == -1) {
          xmlSchemaDeriveFacetErr(pctxt,bflength,fmaxexc,1,1,0);
        }
      }
      if (pxStack_e0 != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(bflength->val,pxStack_e0->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == 1) {
          xmlSchemaDeriveFacetErr(pctxt,bflength,pxStack_e0,-1,1,1);
        }
        if ((iVar3 != 0) && (pxStack_e0->fixed != 0)) {
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)bflength,
                              bflength->node,
                              "The base type\'s facet is \'fixed\', thus the value must not differ",
                              (xmlChar *)0x0);
        }
      }
      if (bfminexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(bflength->val,bfminexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == 1) {
          xmlSchemaDeriveFacetErr(pctxt,bflength,bfminexc,-1,1,1);
        }
      }
      if (bfmaxinc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(bflength->val,bfmaxinc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != 1) {
          xmlSchemaDeriveFacetErr(pctxt,bflength,bfmaxinc,1,0,1);
        }
      }
      if (bfmaxexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(bflength->val,bfmaxexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != 1) {
          xmlSchemaDeriveFacetErr(pctxt,bflength,bfmaxexc,1,0,1);
        }
      }
    }
    if (fmaxexc != (xmlSchemaFacetPtr)0x0) {
      if (fminexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxexc->val,fminexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != -1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxexc,fminexc,-1,0,0);
        }
      }
      if (bfmaxexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxexc->val,bfmaxexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == -1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxexc,bfmaxexc,1,1,1);
        }
        if ((iVar3 != 0) && (bfmaxexc->fixed != 0)) {
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fmaxexc,
                              fmaxexc->node,
                              "The base type\'s facet is \'fixed\', thus the value must not differ",
                              (xmlChar *)0x0);
        }
      }
      if (bfminexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxexc->val,bfminexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == 1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxexc,bfminexc,-1,1,1);
        }
      }
      if (bfmaxinc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxexc->val,bfmaxinc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == -1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxexc,bfmaxinc,1,1,1);
        }
      }
      if (pxStack_e0 != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxexc->val,pxStack_e0->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != -1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxexc,pxStack_e0,-1,0,1);
        }
      }
    }
    if (fmaxinc != (xmlSchemaFacetPtr)0x0) {
      if (bflength != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxinc->val,bflength->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != -1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxinc,bflength,-1,0,0);
        }
      }
      if (bfmaxinc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxinc->val,bfmaxinc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == -1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxinc,bfmaxinc,1,1,1);
        }
        if ((iVar3 != 0) && (bfmaxinc->fixed != 0)) {
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fmaxinc,
                              fmaxinc->node,
                              "The base type\'s facet is \'fixed\', thus the value must not differ",
                              (xmlChar *)0x0);
        }
      }
      if (bfminexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxinc->val,bfminexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 == 1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxinc,bfminexc,-1,1,1);
        }
      }
      if (bfmaxexc != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxinc->val,bfmaxexc->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != 1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxinc,bfmaxexc,1,0,1);
        }
      }
      if (pxStack_e0 != (xmlSchemaFacetPtr)0x0) {
        iVar3 = xmlSchemaCompareValues(fmaxinc->val,pxStack_e0->val);
        if (iVar3 == -2) goto LAB_0021f311;
        if (iVar3 != -1) {
          xmlSchemaDeriveFacetErr(pctxt,fmaxinc,pxStack_e0,-1,0,1);
        }
      }
    }
    if ((ffracdig != (xmlSchemaFacetPtr)0x0) && (bffracdig != (xmlSchemaFacetPtr)0x0)) {
      iVar3 = xmlSchemaCompareValues(ffracdig->val,bffracdig->val);
      if (iVar3 == -2) goto LAB_0021f311;
      if (iVar3 == 1) {
        xmlSchemaDeriveFacetErr(pctxt,ffracdig,bffracdig,-1,1,1);
      }
      if ((iVar3 != 0) && (bffracdig->fixed != 0)) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)ffracdig,
                            ffracdig->node,
                            "The base type\'s facet is \'fixed\', thus the value must not differ",
                            (xmlChar *)0x0);
      }
    }
    if ((fmaxlen != (xmlSchemaFacetPtr)0x0) && (bfmaxlen != (xmlSchemaFacetPtr)0x0)) {
      iVar3 = xmlSchemaCompareValues(fmaxlen->val,bfmaxlen->val);
      if (iVar3 == -2) goto LAB_0021f311;
      if (iVar3 == 1) {
        xmlSchemaDeriveFacetErr(pctxt,fmaxlen,bfmaxlen,-1,1,1);
      }
      if ((iVar3 != 0) && (bfmaxlen->fixed != 0)) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)fmaxlen,
                            fmaxlen->node,
                            "The base type\'s facet is \'fixed\', thus the value must not differ",
                            (xmlChar *)0x0);
      }
    }
    if (ffracdig == (xmlSchemaFacetPtr)0x0) {
      ffracdig = bffracdig;
    }
    if (fmaxlen == (xmlSchemaFacetPtr)0x0) {
      fmaxlen = bfmaxlen;
    }
    if ((ffracdig != (xmlSchemaFacetPtr)0x0) && (fmaxlen != (xmlSchemaFacetPtr)0x0)) {
      iVar3 = xmlSchemaCompareValues(fmaxlen->val,ffracdig->val);
      if (iVar3 == -2) goto LAB_0021f311;
      if (iVar3 == 1) {
        xmlSchemaDeriveFacetErr(pctxt,fmaxlen,ffracdig,-1,1,0);
      }
    }
    for (last = pxVar1->facetSet; last != (xmlSchemaFacetLinkPtr)0x0; last = last->next) {
      pxVar6 = last->facet;
      if ((pxVar6->type != XML_SCHEMA_FACET_PATTERN) &&
         (pxVar6->type != XML_SCHEMA_FACET_ENUMERATION)) {
        for (cur = type->facetSet; cur != (xmlSchemaFacetLinkPtr)0x0; cur = cur->next) {
          item = cur->facet;
          if (item->type == pxVar6->type) {
            if (item->type == XML_SCHEMA_FACET_WHITESPACE) {
              if (item->whitespace < pxVar6->whitespace) {
                xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,
                                    (xmlSchemaBasicItemPtr)item,item->node,
                                    "The \'whitespace\' value has to be equal to or stronger than the \'whitespace\' value of the base type"
                                    ,(xmlChar *)0x0);
              }
              if ((pxVar6->fixed != 0) && (item->whitespace != pxVar6->whitespace)) {
                xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,
                                    (xmlSchemaBasicItemPtr)item,item->node,
                                    "The base type\'s facet is \'fixed\', thus the value must not differ"
                                    ,(xmlChar *)0x0);
              }
            }
            break;
          }
        }
        if (cur == (xmlSchemaFacetLinkPtr)0x0) {
          pxVar6 = (xmlSchemaFacetPtr)(*xmlMalloc)(0x10);
          if (pxVar6 == (xmlSchemaFacetPtr)0x0) {
            xmlSchemaPErrMemory(pctxt,"deriving facets, creating a facet link",(xmlNodePtr)0x0);
            return -1;
          }
          pxVar6->next = last->facet;
          *(undefined8 *)pxVar6 = 0;
          if (facet == (xmlSchemaFacetPtr)0x0) {
            type->facetSet = (xmlSchemaFacetLinkPtr)pxVar6;
            facet = pxVar6;
          }
          else {
            *(xmlSchemaFacetPtr *)facet = pxVar6;
            facet = pxVar6;
          }
        }
      }
    }
    pctxt_local._4_4_ = 0;
  }
  else {
    iVar3 = xmlSchemaCompareValues(ftotdig->val,bftotdig->val);
    if (iVar3 != -2) {
      if ((iVar3 != 0) &&
         (xmlSchemaDeriveFacetErr(pctxt,ftotdig,bftotdig,0,0,1), bftotdig->fixed != 0)) {
        xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)ftotdig,
                            ftotdig->node,
                            "The base type\'s facet is \'fixed\', thus the value must not differ",
                            (xmlChar *)0x0);
      }
      goto LAB_0021e41b;
    }
LAB_0021f311:
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaDeriveAndValidateFacets",
               "an error occurred");
    pctxt_local._4_4_ = -1;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaDeriveAndValidateFacets(xmlSchemaParserCtxtPtr pctxt,
				 xmlSchemaTypePtr type)
{
    xmlSchemaTypePtr base = type->baseType;
    xmlSchemaFacetLinkPtr link, cur, last = NULL;
    xmlSchemaFacetPtr facet, bfacet,
	flength = NULL, ftotdig = NULL, ffracdig = NULL,
	fmaxlen = NULL, fminlen = NULL, /* facets of the current type */
	fmininc = NULL, fmaxinc = NULL,
	fminexc = NULL, fmaxexc = NULL,
	bflength = NULL, bftotdig = NULL, bffracdig = NULL,
	bfmaxlen = NULL, bfminlen = NULL, /* facets of the base type */
	bfmininc = NULL, bfmaxinc = NULL,
	bfminexc = NULL, bfmaxexc = NULL;
    int res; /* err = 0, fixedErr; */

    /*
    * SPEC st-restrict-facets 1:
    * "The {variety} of R is the same as that of B."
    */
    /*
    * SPEC st-restrict-facets 2:
    * "If {variety} is atomic, the {primitive type definition}
    * of R is the same as that of B."
    *
    * NOTE: we leave 1 & 2 out for now, since this will be
    * satisfied by the derivation process.
    * CONSTRUCTION TODO: Maybe needed if using a construction API.
    */
    /*
    * SPEC st-restrict-facets 3:
    * "The {facets} of R are the union of S and the {facets}
    * of B, eliminating duplicates. To eliminate duplicates,
    * when a facet of the same kind occurs in both S and the
    * {facets} of B, the one in the {facets} of B is not
    * included, with the exception of enumeration and pattern
    * facets, for which multiple occurrences with distinct values
    * are allowed."
    */

    if ((type->facetSet == NULL) && (base->facetSet == NULL))
	return (0);

    last = type->facetSet;
    if (last != NULL)
	while (last->next != NULL)
	    last = last->next;

    for (cur = type->facetSet; cur != NULL; cur = cur->next) {
	facet = cur->facet;
	switch (facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
		flength = facet; break;
	    case XML_SCHEMA_FACET_MINLENGTH:
		fminlen = facet; break;
	    case XML_SCHEMA_FACET_MININCLUSIVE:
		fmininc = facet; break;
	    case XML_SCHEMA_FACET_MINEXCLUSIVE:
		fminexc = facet; break;
	    case XML_SCHEMA_FACET_MAXLENGTH:
		fmaxlen = facet; break;
	    case XML_SCHEMA_FACET_MAXINCLUSIVE:
		fmaxinc = facet; break;
	    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
		fmaxexc = facet; break;
	    case XML_SCHEMA_FACET_TOTALDIGITS:
		ftotdig = facet; break;
	    case XML_SCHEMA_FACET_FRACTIONDIGITS:
		ffracdig = facet; break;
	    default:
		break;
	}
    }
    for (cur = base->facetSet; cur != NULL; cur = cur->next) {
	facet = cur->facet;
	switch (facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
		bflength = facet; break;
	    case XML_SCHEMA_FACET_MINLENGTH:
		bfminlen = facet; break;
	    case XML_SCHEMA_FACET_MININCLUSIVE:
		bfmininc = facet; break;
	    case XML_SCHEMA_FACET_MINEXCLUSIVE:
		bfminexc = facet; break;
	    case XML_SCHEMA_FACET_MAXLENGTH:
		bfmaxlen = facet; break;
	    case XML_SCHEMA_FACET_MAXINCLUSIVE:
		bfmaxinc = facet; break;
	    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
		bfmaxexc = facet; break;
	    case XML_SCHEMA_FACET_TOTALDIGITS:
		bftotdig = facet; break;
	    case XML_SCHEMA_FACET_FRACTIONDIGITS:
		bffracdig = facet; break;
	    default:
		break;
	}
    }
    /*
    * length and minLength or maxLength (2.2) + (3.2)
    */
    if (flength && (fminlen || fmaxlen)) {
	FACET_RESTR_ERR(flength, "It is an error for both 'length' and "
	    "either of 'minLength' or 'maxLength' to be specified on "
	    "the same type definition")
    }
    /*
    * Mutual exclusions in the same derivation step.
    */
    if ((fmaxinc) && (fmaxexc)) {
	/*
	* SCC "maxInclusive and maxExclusive"
	*/
	FACET_RESTR_MUTUAL_ERR(fmaxinc, fmaxexc)
    }
    if ((fmininc) && (fminexc)) {
	/*
	* SCC "minInclusive and minExclusive"
	*/
	FACET_RESTR_MUTUAL_ERR(fmininc, fminexc)
    }

    if (flength && bflength) {
	/*
	* SCC "length valid restriction"
	* The values have to be equal.
	*/
	res = xmlSchemaCompareValues(flength->val, bflength->val);
	if (res == -2)
	    goto internal_error;
	if (res != 0)
	    xmlSchemaDeriveFacetErr(pctxt, flength, bflength, 0, 0, 1);
	if ((res != 0) && (bflength->fixed)) {
	    FACET_RESTR_FIXED_ERR(flength)
	}

    }
    if (fminlen && bfminlen) {
	/*
	* SCC "minLength valid restriction"
	* minLength >= BASE minLength
	*/
	res = xmlSchemaCompareValues(fminlen->val, bfminlen->val);
	if (res == -2)
	    goto internal_error;
	if (res == -1)
	    xmlSchemaDeriveFacetErr(pctxt, fminlen, bfminlen, 1, 1, 1);
	if ((res != 0) && (bfminlen->fixed)) {
	    FACET_RESTR_FIXED_ERR(fminlen)
	}
    }
    if (fmaxlen && bfmaxlen) {
	/*
	* SCC "maxLength valid restriction"
	* maxLength <= BASE minLength
	*/
	res = xmlSchemaCompareValues(fmaxlen->val, bfmaxlen->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, fmaxlen, bfmaxlen, -1, 1, 1);
	if ((res != 0) && (bfmaxlen->fixed)) {
	    FACET_RESTR_FIXED_ERR(fmaxlen)
	}
    }
    /*
    * SCC "length and minLength or maxLength"
    */
    if (! flength)
	flength = bflength;
    if (flength) {
	if (! fminlen)
	    fminlen = bfminlen;
	if (fminlen) {
	    /* (1.1) length >= minLength */
	    res = xmlSchemaCompareValues(flength->val, fminlen->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1)
		xmlSchemaDeriveFacetErr(pctxt, flength, fminlen, 1, 1, 0);
	}
	if (! fmaxlen)
	    fmaxlen = bfmaxlen;
	if (fmaxlen) {
	    /* (2.1) length <= maxLength */
	    res = xmlSchemaCompareValues(flength->val, fmaxlen->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1)
		xmlSchemaDeriveFacetErr(pctxt, flength, fmaxlen, -1, 1, 0);
	}
    }
    if (fmaxinc) {
	/*
	* "maxInclusive"
	*/
	if (fmininc) {
	    /* SCC "maxInclusive >= minInclusive" */
	    res = xmlSchemaCompareValues(fmaxinc->val, fmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, fmininc, 1, 1, 0);
	    }
	}
	/*
	* SCC "maxInclusive valid restriction"
	*/
	if (bfmaxinc) {
	    /* maxInclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1)
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmaxinc, -1, 1, 1);
	    if ((res != 0) && (bfmaxinc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmaxinc)
	    }
	}
	if (bfmaxexc) {
	    /* maxInclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmaxexc, -1, 0, 1);
	    }
	}
	if (bfmininc) {
	    /* maxInclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmininc, 1, 1, 1);
	    }
	}
	if (bfminexc) {
	    /* maxInclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfminexc, 1, 0, 1);
	    }
	}
    }
    if (fmaxexc) {
	/*
	* "maxExclusive >= minExclusive"
	*/
	if (fminexc) {
	    res = xmlSchemaCompareValues(fmaxexc->val, fminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, fminexc, 1, 1, 0);
	    }
	}
	/*
	* "maxExclusive valid restriction"
	*/
	if (bfmaxexc) {
	    /* maxExclusive <= BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmaxexc, -1, 1, 1);
	    }
	    if ((res != 0) && (bfmaxexc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmaxexc)
	    }
	}
	if (bfmaxinc) {
	    /* maxExclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfmininc) {
	    /* maxExclusive > BASE minInclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmininc, 1, 0, 1);
	    }
	}
	if (bfminexc) {
	    /* maxExclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfminexc, 1, 0, 1);
	    }
	}
    }
    if (fminexc) {
	/*
	* "minExclusive < maxInclusive"
	*/
	if (fmaxinc) {
	    res = xmlSchemaCompareValues(fminexc->val, fmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, fmaxinc, -1, 0, 0);
	    }
	}
	/*
	* "minExclusive valid restriction"
	*/
	if (bfminexc) {
	    /* minExclusive >= BASE minExclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfminexc, 1, 1, 1);
	    }
	    if ((res != 0) && (bfminexc->fixed)) {
		FACET_RESTR_FIXED_ERR(fminexc)
	    }
	}
	if (bfmaxinc) {
	    /* minExclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfmininc) {
	    /* minExclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmininc, 1, 1, 1);
	    }
	}
	if (bfmaxexc) {
	    /* minExclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmaxexc, -1, 0, 1);
	    }
	}
    }
    if (fmininc) {
	/*
	* "minInclusive < maxExclusive"
	*/
	if (fmaxexc) {
	    res = xmlSchemaCompareValues(fmininc->val, fmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, fmaxexc, -1, 0, 0);
	    }
	}
	/*
	* "minExclusive valid restriction"
	*/
	if (bfmininc) {
	    /* minInclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmininc, 1, 1, 1);
	    }
	    if ((res != 0) && (bfmininc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmininc)
	    }
	}
	if (bfmaxinc) {
	    /* minInclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfminexc) {
	    /* minInclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1)
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfminexc, 1, 0, 1);
	}
	if (bfmaxexc) {
	    /* minInclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1)
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmaxexc, -1, 0, 1);
	}
    }
    if (ftotdig && bftotdig) {
	/*
	* SCC " totalDigits valid restriction"
	* totalDigits <= BASE totalDigits
	*/
	res = xmlSchemaCompareValues(ftotdig->val, bftotdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ftotdig, bftotdig,
	    -1, 1, 1);
	if ((res != 0) && (bftotdig->fixed)) {
	    FACET_RESTR_FIXED_ERR(ftotdig)
	}
    }
    if (ffracdig && bffracdig) {
	/*
	* SCC  "fractionDigits valid restriction"
	* fractionDigits <= BASE fractionDigits
	*/
	res = xmlSchemaCompareValues(ffracdig->val, bffracdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ffracdig, bffracdig,
	    -1, 1, 1);
	if ((res != 0) && (bffracdig->fixed)) {
	    FACET_RESTR_FIXED_ERR(ffracdig)
	}
    }
    /*
    * SCC "fractionDigits less than or equal to totalDigits"
    */
    if (! ftotdig)
	ftotdig = bftotdig;
    if (! ffracdig)
	ffracdig = bffracdig;
    if (ftotdig && ffracdig) {
	res = xmlSchemaCompareValues(ffracdig->val, ftotdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ffracdig, ftotdig,
		-1, 1, 0);
    }
    /*
    * *Enumerations* won' be added here, since only the first set
    * of enumerations in the ancestor-or-self axis is used
    * for validation, plus we need to use the base type of those
    * enumerations for whitespace.
    *
    * *Patterns*: won't be add here, since they are ORed at
    * type level and ANDed at ancestor level. This will
    * happen during validation by walking the base axis
    * of the type.
    */
    for (cur = base->facetSet; cur != NULL; cur = cur->next) {
	bfacet = cur->facet;
	/*
	* Special handling of enumerations and patterns.
	* TODO: hmm, they should not appear in the set, so remove this.
	*/
	if ((bfacet->type == XML_SCHEMA_FACET_PATTERN) ||
	    (bfacet->type == XML_SCHEMA_FACET_ENUMERATION))
	    continue;
	/*
	* Search for a duplicate facet in the current type.
	*/
	link = type->facetSet;
	/* err = 0; */
	/* fixedErr = 0; */
	while (link != NULL) {
	    facet = link->facet;
	    if (facet->type == bfacet->type) {
		switch (facet->type) {
		    case XML_SCHEMA_FACET_WHITESPACE:
			/*
			* The whitespace must be stronger.
			*/
			if (facet->whitespace < bfacet->whitespace) {
			    FACET_RESTR_ERR(facet,
				"The 'whitespace' value has to be equal to "
				"or stronger than the 'whitespace' value of "
				"the base type")
			}
			if ((bfacet->fixed) &&
			    (facet->whitespace != bfacet->whitespace)) {
			    FACET_RESTR_FIXED_ERR(facet)
			}
			break;
		    default:
			break;
		}
		/* Duplicate found. */
		break;
	    }
	    link = link->next;
	}
	/*
	* If no duplicate was found: add the base types's facet
	* to the set.
	*/
	if (link == NULL) {
	    link = (xmlSchemaFacetLinkPtr)
		xmlMalloc(sizeof(xmlSchemaFacetLink));
	    if (link == NULL) {
		xmlSchemaPErrMemory(pctxt,
		    "deriving facets, creating a facet link", NULL);
		return (-1);
	    }
	    link->facet = cur->facet;
	    link->next = NULL;
	    if (last == NULL)
		type->facetSet = link;
	    else
		last->next = link;
	    last = link;
	}

    }

    return (0);
internal_error:
    PERROR_INT("xmlSchemaDeriveAndValidateFacets",
	"an error occurred");
    return (-1);
}